

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoquad.h
# Opt level: O2

void pzgeom::TPZGeoQuad::X<Fad<double>>
               (TPZFMatrix<double> *nodes,TPZVec<Fad<double>_> *loc,TPZVec<Fad<double>_> *x)

{
  uint uVar1;
  ulong uVar2;
  Fad<double> *pFVar3;
  int j;
  long row;
  ulong uVar4;
  FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_> local_328;
  TPZFNMatrix<4,_Fad<double>_> phi;
  TPZFNMatrix<8,_Fad<double>_> dphi;
  
  TPZFNMatrix<4,_Fad<double>_>::TPZFNMatrix(&phi,4,1);
  TPZFNMatrix<8,_Fad<double>_>::TPZFNMatrix(&dphi,2,4);
  pztopology::TPZQuadrilateral::TShape<Fad<double>>
            (loc,&phi.super_TPZFMatrix<Fad<double>_>,&dphi.super_TPZFMatrix<Fad<double>_>);
  uVar1 = (uint)(nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  uVar4 = 0;
  uVar2 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar2 = uVar4;
  }
  for (; uVar4 != uVar2; uVar4 = uVar4 + 1) {
    local_328.fadexpr_.left_ = (Fad<double> *)0x0;
    Fad<double>::operator=<double,_nullptr>(x->fStore + uVar4,(double *)&local_328);
    for (row = 0; row != 4; row = row + 1) {
      pFVar3 = TPZFMatrix<Fad<double>_>::operator()(&phi.super_TPZFMatrix<Fad<double>_>,row,0);
      (*(nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24]
      )(nodes,uVar4,row);
      local_328.fadexpr_.right_.defaultVal = 0.0;
      local_328.fadexpr_.left_ = pFVar3;
      Fad<double>::operator+=(x->fStore + uVar4,&local_328);
    }
  }
  TPZFNMatrix<8,_Fad<double>_>::~TPZFNMatrix(&dphi);
  TPZFNMatrix<4,_Fad<double>_>::~TPZFNMatrix(&phi);
  return;
}

Assistant:

inline void TPZGeoQuad::X(const TPZFMatrix<REAL> &nodes,TPZVec<T> &loc,TPZVec<T> &x){
        
        TPZFNMatrix<4,T> phi(NNodes,1);
        TPZFNMatrix<8,T> dphi(2,NNodes);
        TShape(loc,phi,dphi);
        int space = nodes.Rows();
        
        for(int i = 0; i < space; i++) {
            x[i] = 0.0;
            for(int j = 0; j < 4; j++) {
                x[i] += phi(j,0)*nodes.GetVal(i,j);
            }
        }
        
    }